

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O2

void __thiscall
chrono::ChLoaderUVWatomic::ChLoaderUVWatomic
          (ChLoaderUVWatomic *this,shared_ptr<chrono::ChLoadableUVW> *mloadable,double mU,double mV,
          double mW)

{
  __shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderUVW::ChLoaderUVW(&this->super_ChLoaderUVW,(shared_ptr<chrono::ChLoadableUVW> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader = (_func_int **)&PTR__ChLoaderUVW_001466b0
  ;
  this->Pu = mU;
  this->Pv = mV;
  this->Pw = mW;
  return;
}

Assistant:

ChLoaderUVWatomic(std::shared_ptr<ChLoadableUVW> mloadable, double mU, double mV, double mW)
        : ChLoaderUVW(mloadable), Pu(mU), Pv(mV), Pw(mW) {}